

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicitMaxArray::Run
          (UniformLocMixWithImplicitMaxArray *this)

{
  int _arraySize;
  ulong uVar1;
  int _arraySize_00;
  long lVar2;
  ulong uVar3;
  Loc _location;
  Loc _location_00;
  GLint max;
  UniformValueGenerator *local_3f0;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  int tests [3];
  UniformType local_3b8;
  UniformType local_328;
  UniformType local_298;
  Uniform local_208;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x826e,&max);
  tests[0] = 0;
  tests[1] = 3;
  tests[2] = max + -4;
  local_3f0 = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  lVar2 = 0;
  uVar3 = 0;
  do {
    if (lVar2 == 3) {
      return uVar3;
    }
    uniforms.
    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uniforms.
    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uniforms.
    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    _arraySize = tests[lVar2];
    if (0 < _arraySize) {
      UniformType::UniformType(&local_3b8,0x1406,_arraySize);
      anon_unknown_0::Uniform::Uniform
                (&local_208,local_3f0,&local_3b8,(Loc)ZEXT812(0),(DefOccurence)0x0,(DefOccurence)0x5
                );
      std::
      vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ::push_back(&uniforms,&local_208);
      anon_unknown_0::Uniform::~Uniform(&local_208);
      UniformType::~UniformType(&local_3b8);
      if (uniforms.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type.arraySize +
          uniforms.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].location.super_LayoutSpecifierBase.val !=
          _arraySize) {
        __assert_fail("uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == tests[test]"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x9ba,
                      "virtual long glcts::(anonymous namespace)::UniformLocMixWithImplicitMaxArray::Run()"
                     );
      }
    }
    _arraySize_00 = (max + -3) - _arraySize;
    if (_arraySize_00 != 0 && _arraySize <= max + -3) {
      UniformType::UniformType(&local_298,0x1406,_arraySize_00);
      _location.super_LayoutSpecifierBase.numSys = Dec;
      _location.super_LayoutSpecifierBase.occurence.occurence = ALL_SH;
      _location.super_LayoutSpecifierBase.val = _arraySize + 3;
      anon_unknown_0::Uniform::Uniform
                (&local_208,local_3f0,&local_298,_location,(DefOccurence)0x0,(DefOccurence)0x5);
      std::
      vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ::push_back(&uniforms,&local_208);
      anon_unknown_0::Uniform::~Uniform(&local_208);
      UniformType::~UniformType(&local_298);
      if (uniforms.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type.arraySize +
          uniforms.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].location.super_LayoutSpecifierBase.val !=
          max) {
        __assert_fail("uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == max"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x9c4,
                      "virtual long glcts::(anonymous namespace)::UniformLocMixWithImplicitMaxArray::Run()"
                     );
      }
    }
    UniformType::UniformType(&local_328,0x1406,3);
    _location_00.super_LayoutSpecifierBase.occurence.occurence = NONE_SH;
    _location_00.super_LayoutSpecifierBase.val = 1999999;
    _location_00.super_LayoutSpecifierBase.numSys = Dec;
    anon_unknown_0::Uniform::Uniform
              (&local_208,local_3f0,&local_328,_location_00,(DefOccurence)0x0,(DefOccurence)0x0);
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::push_back(&uniforms,&local_208);
    anon_unknown_0::Uniform::~Uniform(&local_208);
    UniformType::~UniformType(&local_328);
    uVar1 = ExplicitUniformLocationCaseBase::doRun
                      (&this->super_ExplicitUniformLocationCaseBase,&uniforms);
    uVar3 = uVar3 | uVar1;
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::~vector(&uniforms);
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

virtual long Run()
	{
		long ret = NO_ERROR;

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

		const int implicitCount = 3;

		int tests[3] = { 0, 3, max - 4 };

		for (int test = 0; test < 3; test++)
		{
			std::vector<Uniform> uniforms;

			//for performance reasons fill-up all avaliable locations with an unused arrays.
			if (tests[test] > 0)
			{
				//[0..test - 1]
				uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, tests[test]), Loc::C(0),
										   DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   tests[test]);
			}

			if (tests[test] < max - implicitCount)
			{
				//[test + 3 ..max]
				uniforms.push_back(
					Uniform(uniformValueGenerator, UniformType(GL_FLOAT, max - implicitCount - tests[test]),
							Loc::C(tests[test] + implicitCount), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   max);
			}
			uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, implicitCount), Loc::Implicit()));
			ret |= doRun(uniforms);
		}
		return ret;
	}